

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# component.cpp
# Opt level: O1

void __thiscall
Component_preventSegfaultInAddSomething_Test::~Component_preventSegfaultInAddSomething_Test
          (Component_preventSegfaultInAddSomething_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Component, preventSegfaultInAddSomething)
{
    auto model = libcellml::Model::create("model");
    auto component = libcellml::Component::create("component");

    // Tests to show segfaults fixed when dodgy things are added to other things,
    // now they return false instead of segfault.
    EXPECT_FALSE(component->addVariable(nullptr));
    EXPECT_FALSE(component->addReset(nullptr));
    EXPECT_FALSE(component->addComponent(nullptr));
    EXPECT_FALSE(model->addComponent(nullptr));
    EXPECT_FALSE(model->addUnits(nullptr));
}